

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f *pFilm,Point2f *lensSample,Float *sampleBoundsArea)

{
  undefined8 uVar1;
  Tuple3<pbrt::Point3,_float> TVar2;
  size_t sVar3;
  int *piVar4;
  float *in_RCX;
  float *in_RSI;
  long in_RDI;
  Float FVar5;
  float fVar6;
  undefined4 uVar7;
  double dVar8;
  undefined1 extraout_var [12];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  Float cosTheta;
  Float sinTheta;
  Point2f pLens;
  Bounds2f pupilBounds;
  int rIndex;
  Float rFilm;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  float fVar12;
  undefined4 in_stack_ffffffffffffff7c;
  uint local_54;
  float fStack_50;
  int local_3c;
  int local_38;
  float local_34;
  float *local_30;
  float *local_20;
  undefined8 local_c;
  float local_4;
  undefined1 extraout_var_00 [56];
  
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)*in_RSI),ZEXT416((uint)*in_RSI),
                            ZEXT416((uint)(in_RSI[1] * in_RSI[1])));
  local_30 = in_RCX;
  local_20 = in_RSI;
  dVar8 = std::sqrt(auVar10._0_8_);
  local_34 = SUB84(dVar8,0);
  FVar5 = FilmHandle::Diagonal
                    ((FilmHandle *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  auVar10._0_4_ = FVar5 / 2.0;
  auVar10._4_12_ = extraout_var;
  fVar6 = SUB84(dVar8,0) / auVar10._0_4_;
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  auVar10 = vcvtusi2ss_avx512f(auVar10,sVar3);
  local_38 = (int)(fVar6 * auVar10._0_4_);
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  local_3c = (int)sVar3 + -1;
  piVar4 = std::min<int>(&local_3c,&local_38);
  local_38 = *piVar4;
  pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
  operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
              *)(in_RDI + 0x4c8),(long)local_38);
  if (local_30 != (float *)0x0) {
    fVar6 = Bounds2<float>::Area
                      ((Bounds2<float> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    *local_30 = fVar6;
  }
  auVar9._0_8_ = Bounds2<float>::Lerp
                           ((Bounds2<float> *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (Point2f *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                           );
  auVar9._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  if ((local_34 != 0.0) || (NAN(local_34))) {
    fVar6 = local_20[1] / local_34;
  }
  else {
    fVar6 = 0.0;
  }
  if ((local_34 != 0.0) || (NAN(local_34))) {
    fVar12 = *local_20 / local_34;
  }
  else {
    fVar12 = 1.0;
  }
  local_54 = (uint)uVar1;
  fStack_50 = (float)((ulong)uVar1 >> 0x20);
  auVar10 = vfmsub213ss_fma(ZEXT416(local_54),ZEXT416((uint)fVar12),
                            ZEXT416((uint)(fVar6 * fStack_50)));
  uVar11 = auVar10._0_4_;
  auVar10 = vfmadd213ss_fma(ZEXT416(local_54),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(fVar12 * fStack_50)));
  uVar7 = auVar10._0_4_;
  LensRearZ((RealisticCamera *)0x6961eb);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(uVar11,uVar7),in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff68,0.0);
  TVar2.z = local_4;
  TVar2.x = (float)(undefined4)local_c;
  TVar2.y = (float)local_c._4_4_;
  return (Point3f)TVar2;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(const Point2f &pFilm, const Point2f &lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(pFilm.x * pFilm.x + pFilm.y * pFilm.y);
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}